

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_buffer.cpp
# Opt level: O0

void __thiscall BmsBuffer::MagnifyBy(BmsBuffer *this,double multiplier)

{
  bool bVar1;
  uint uVar2;
  _Self *p_Var3;
  pointer ppVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  _Self local_38;
  int local_2c;
  _Rb_tree_iterator<std::pair<const_int,_BmsWord>_> local_28;
  _Rb_tree_iterator<std::pair<const_int,_BmsWord>_> local_20;
  _Self it;
  double multiplier_local;
  BmsBuffer *this_local;
  
  it._M_node = (_Base_ptr)multiplier;
  uVar2 = GetObjectCount(this);
  if (uVar2 != 0) {
    local_28._M_node = (_Base_ptr)End(this);
    p_Var3 = std::_Rb_tree_iterator<std::pair<const_int,_BmsWord>_>::operator--(&local_28);
    local_20._M_node = p_Var3->_M_node;
    while( true ) {
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_BmsWord>_>::operator->(&local_20);
      pmVar5 = std::
               map<int,_BmsWord,_std::less<int>,_std::allocator<std::pair<const_int,_BmsWord>_>_>::
               operator[](&this->array_,&ppVar4->first);
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_BmsWord>_>::operator->(&local_20);
      local_2c = (int)((double)ppVar4->first * (double)it._M_node);
      pmVar6 = std::
               map<int,_BmsWord,_std::less<int>,_std::allocator<std::pair<const_int,_BmsWord>_>_>::
               operator[](&this->array_,&local_2c);
      pmVar6->value_ = pmVar5->value_;
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_BmsWord>_>::operator->(&local_20);
      DeleteAt(this,ppVar4->first);
      local_38._M_node = (_Base_ptr)Begin(this);
      bVar1 = std::operator==(&local_20,&local_38);
      if (bVar1) break;
      std::_Rb_tree_iterator<std::pair<const_int,_BmsWord>_>::operator--(&local_20);
    }
  }
  return;
}

Assistant:

void
BmsBuffer::MagnifyBy(double multiplier)
{
	if (GetObjectCount() == 0) return;
	for (auto it = --End();; --it) {
		array_[it->first * multiplier] = array_[it->first];
		DeleteAt(it->first);
		if (it == Begin()) break;
	}
}